

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  char *__str;
  uchar *data;
  size_type size;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view sVar3;
  Result local_1e8;
  Enum local_1e4;
  string local_1e0;
  Enum local_1bc;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1b8;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_188;
  undefined1 local_158 [8];
  BinaryReaderStrip reader;
  ReadBinaryOptions options;
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  bool kReadDebugNames;
  Features features;
  Errors errors;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  Enum local_3c;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Result result;
  char **argv_local;
  int argc_local;
  
  wabt::Result::Result
            ((Result *)
             ((long)&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  __str = (char *)std::__cxx11::string::c_str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,__str);
  sVar3._M_str = local_38;
  sVar3._M_len = (size_t)local_50._M_str;
  local_3c = (Enum)wabt::ReadFile((wabt *)local_50._M_len,sVar3,in_RCX);
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_3c;
  bVar1 = wabt::Failed((Result)local_3c);
  if (bVar1) {
    argv_local._4_4_ = Error;
  }
  else {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&features.annotations_enabled_);
    wabt::Features::Features((Features *)&options.field_0x25);
    wabt::Features::EnableAll((Features *)&options.field_0x25);
    options._36_1_ = 0;
    options.skip_function_bodies = true;
    options.fail_on_custom_section_error = false;
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)&reader.section_start_,(Features *)&options.field_0x25,
               (Stream *)0x0,false,true,false);
    std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::set(&local_188,&v_sections_to_keep);
    std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::set(&local_1b8,&v_sections_to_remove);
    BinaryReaderStrip::BinaryReaderStrip
              ((BinaryReaderStrip *)local_158,&local_188,&local_1b8,
               (Errors *)&features.annotations_enabled_);
    std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~set(&local_1b8);
    std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~set(&local_188);
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    local_1bc = (Enum)wabt::ReadBinary(data,size,(BinaryReaderDelegate *)local_158,
                                       (ReadBinaryOptions *)&reader.section_start_);
    file = _stderr;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_1bc;
    std::__cxx11::string::string((string *)&local_1e0);
    wabt::FormatErrorsToFile
              ((Errors *)&features.annotations_enabled_,Binary,(LexerSourceLineFinder *)0x0,file,
               &local_1e0,Never,0x50);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_1e4 = file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
    bVar1 = wabt::Failed(file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    if (bVar1) {
      argv_local._4_4_ = Error;
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)&s_outfile_abi_cxx11_,(string *)&s_filename_abi_cxx11_);
      }
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&s_outfile_abi_cxx11_);
      local_1e8 = BinaryReaderStrip::WriteToFile((BinaryReaderStrip *)local_158,sVar3);
      argv_local._4_4_ = wabt::Result::operator_cast_to_Enum(&local_1e8);
    }
    BinaryReaderStrip::~BinaryReaderStrip((BinaryReaderStrip *)local_158);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&features.annotations_enabled_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return argv_local._4_4_;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_filename.c_str(), &file_data);
  if (Failed(result)) {
    return Result::Error;
  }

  Errors errors;
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = false;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions options(features, nullptr, kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);

  BinaryReaderStrip reader(v_sections_to_keep, v_sections_to_remove, &errors);
  result = ReadBinary(file_data.data(), file_data.size(), &reader, options);
  FormatErrorsToFile(errors, Location::Type::Binary);
  if (Failed(result)) {
    return Result::Error;
  }

  if (s_outfile.empty()) {
    s_outfile = s_filename;
  }
  return reader.WriteToFile(s_outfile);
}